

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void do_chdir(bsdtar_conflict *bsdtar)

{
  int iVar1;
  long in_RDI;
  
  if (*(long *)(in_RDI + 8) != 0) {
    iVar1 = chdir(*(char **)(in_RDI + 8));
    if (iVar1 != 0) {
      lafe_errc(1,0,"could not chdir to \'%s\'\n",*(undefined8 *)(in_RDI + 8));
    }
    free(*(void **)(in_RDI + 8));
    *(undefined8 *)(in_RDI + 8) = 0;
  }
  return;
}

Assistant:

void
do_chdir(struct bsdtar *bsdtar)
{
	if (bsdtar->pending_chdir == NULL)
		return;

	if (chdir(bsdtar->pending_chdir) != 0) {
		lafe_errc(1, 0, "could not chdir to '%s'\n",
		    bsdtar->pending_chdir);
	}
	free(bsdtar->pending_chdir);
	bsdtar->pending_chdir = NULL;
}